

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::ProcessModule(cmRST *this,istream *is)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  long local_70;
  size_type pos;
  undefined1 local_58 [8];
  string rst;
  string line;
  istream *is_local;
  cmRST *this_local;
  
  std::__cxx11::string::string((string *)(rst.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
LAB_004f8680:
  do {
    while( true ) {
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          (is,(string *)((long)&rst.field_2 + 8),(bool *)0x0,-1);
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,"#");
          if (bVar1) {
            Reset(this);
          }
          std::__cxx11::string::~string((string *)local_58);
          std::__cxx11::string::~string((string *)(rst.field_2._M_local_buf + 8));
          return;
        }
        uVar2 = std::__cxx11::string::empty();
        if (((uVar2 & 1) != 0) ||
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,"#"), !bVar1)) break;
        local_70 = std::__cxx11::string::find
                             ((string *)(rst.field_2._M_local_buf + 8),(ulong)local_58);
        if (local_70 == -1) {
          ProcessLine(this,(string *)((long)&rst.field_2 + 8));
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&rst.field_2 + 8));
          if (*pcVar3 != '#') {
            std::__cxx11::string::substr((ulong)&local_90,(ulong)((long)&rst.field_2 + 8));
            ProcessLine(this,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
          }
          std::__cxx11::string::operator=((string *)local_58,"");
          Reset(this);
          this->OutputLinePending = true;
        }
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"#");
      if (bVar1) break;
LAB_004f89bb:
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&rst.field_2 + 8),"#.rst:");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_58,"#");
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&this->ModuleRST,(string *)((long)&rst.field_2 + 8));
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_158,&this->ModuleRST,1);
          std::operator+(&local_138,"]",&local_158);
          std::operator+(&local_118,&local_138,"]");
          std::__cxx11::string::operator=((string *)local_58,(string *)&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_158);
        }
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&rst.field_2 + 8),"#");
    if (!bVar1) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)((long)&rst.field_2 + 8));
      bVar1 = std::operator==(&local_d8,"# ");
      std::__cxx11::string::~string((string *)&local_d8);
      if (!bVar1) {
        std::__cxx11::string::operator=((string *)local_58,"");
        Reset(this);
        this->OutputLinePending = true;
        goto LAB_004f89bb;
      }
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)((long)&rst.field_2 + 8));
      ProcessLine(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      goto LAB_004f8680;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
    ProcessLine(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  } while( true );
}

Assistant:

void cmRST::ProcessModule(std::istream& is)
{
  std::string line;
  std::string rst;
  while(cmSystemTools::GetLineFromStream(is, line))
    {
    if(!rst.empty() && rst != "#")
      {
      // Bracket mode: check for end bracket
      std::string::size_type pos = line.find(rst);
      if(pos == line.npos)
        {
        this->ProcessLine(line);
        }
      else
        {
        if(line[0] != '#')
          {
          this->ProcessLine(line.substr(0, pos));
          }
        rst = "";
        this->Reset();
        this->OutputLinePending = true;
        }
      }
    else
      {
      // Line mode: check for .rst start (bracket or line)
      if(rst == "#")
        {
        if(line == "#")
          {
          this->ProcessLine("");
          continue;
          }
        else if(line.substr(0, 2) == "# ")
          {
          this->ProcessLine(line.substr(2, line.npos));
          continue;
          }
        else
          {
          rst = "";
          this->Reset();
          this->OutputLinePending = true;
          }
        }
      if(line == "#.rst:")
        {
        rst = "#";
        }
      else if(this->ModuleRST.find(line))
        {
        rst = "]" + this->ModuleRST.match(1) + "]";
        }
      }
    }
  if(rst == "#")
    {
    this->Reset();
    }
}